

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void DockNodeSetupHostWindow(ImGuiDockNode *node,ImGuiWindow_conflict *host_window)

{
  ImGuiWindow_conflict *pIVar1;
  
  pIVar1 = node->HostWindow;
  if ((pIVar1 != host_window && pIVar1 != (ImGuiWindow_conflict *)0x0) &&
     (pIVar1->DockNodeAsHost == node)) {
    pIVar1->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  host_window->DockNodeAsHost = node;
  node->HostWindow = host_window;
  return;
}

Assistant:

static void DockNodeSetupHostWindow(ImGuiDockNode* node, ImGuiWindow* host_window)
{
    // Remove ourselves from any previous different host window
    // This can happen if a user mistakenly does (see #4295 for details):
    //  - N+0: DockBuilderAddNode(id, 0)    // missing ImGuiDockNodeFlags_DockSpace
    //  - N+1: NewFrame()                   // will create floating host window for that node
    //  - N+1: DockSpace(id)                // requalify node as dockspace, moving host window
    if (node->HostWindow && node->HostWindow != host_window && node->HostWindow->DockNodeAsHost == node)
        node->HostWindow->DockNodeAsHost = NULL;

    host_window->DockNodeAsHost = node;
    node->HostWindow = host_window;
}